

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.h
# Opt level: O2

QSet<QByteArray> __thiscall SymbolStack::excludeSymbols(SymbolStack *this)

{
  long in_RSI;
  SafeSymbols *sf;
  long lVar1;
  long lVar2;
  
  (this->super_QStack<SafeSymbols>).super_QList<SafeSymbols>.d.d = (Data *)0x0;
  lVar1 = *(long *)(in_RSI + 8);
  for (lVar2 = *(long *)(in_RSI + 0x10) << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
    QSet<QByteArray>::operator<<((QSet<QByteArray> *)this,(QByteArray *)(lVar1 + 0x18));
    QSet<QByteArray>::unite((QSet<QByteArray> *)this,(QSet<QByteArray> *)(lVar1 + 0x30));
    lVar1 = lVar1 + 0x40;
  }
  return (QSet<QByteArray>)(Hash)this;
}

Assistant:

inline QSet<QByteArray> SymbolStack::excludeSymbols() const
{
    QSet<QByteArray> set;
    for (const SafeSymbols &sf : *this) {
        set << sf.expandedMacro;
        set += sf.excludedSymbols;
    }
    return set;
}